

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCreateMffc(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,char *pNodeName)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *vCone_00;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p1;
  int local_440;
  int local_43c;
  int k;
  int i;
  char Buffer [1000];
  Vec_Ptr_t *vSupp;
  Vec_Ptr_t *vCone;
  Abc_Obj_t *pNodeCoNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  char *pNodeName_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsStrash(pNtk), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x439,"Abc_Ntk_t *Abc_NtkCreateMffc(Abc_Ntk_t *, Abc_Obj_t *, char *)");
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 != 0) {
    pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
    sprintf((char *)&k,"%s_%s",pNtk->pName,pNodeName);
    pcVar2 = Extra_UtilStrsav((char *)&k);
    pNtk_00->pName = pcVar2;
    iVar1 = Abc_NtkIsStrash(pNtk);
    if (iVar1 != 0) {
      pAVar3 = Abc_AigConst1(pNtk_00);
      pAVar4 = Abc_AigConst1(pNtk);
      (pAVar4->field_6).pCopy = pAVar3;
    }
    vCone_00 = Vec_PtrAlloc(100);
    Buffer._992_8_ = Vec_PtrAlloc(100);
    Abc_NodeDeref_rec(pNode);
    Abc_NodeMffcConeSupp(pNode,vCone_00,(Vec_Ptr_t *)Buffer._992_8_);
    Abc_NodeRef_rec(pNode);
    for (local_43c = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)Buffer._992_8_), local_43c < iVar1;
        local_43c = local_43c + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)Buffer._992_8_,local_43c);
      pAVar3 = Abc_NtkCreatePi(pNtk_00);
      (pAVar4->field_6).pCopy = pAVar3;
      pAVar3 = (pAVar4->field_6).pCopy;
      pcVar2 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar3,pcVar2,(char *)0x0);
    }
    pAVar3 = Abc_NtkCreatePo(pNtk_00);
    Abc_ObjAssignName(pAVar3,pNodeName,(char *)0x0);
    for (local_43c = 0; iVar1 = Vec_PtrSize(vCone_00), local_43c < iVar1; local_43c = local_43c + 1)
    {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vCone_00,local_43c);
      iVar1 = Abc_NtkIsStrash(pNtk);
      if (iVar1 == 0) {
        Abc_NtkDupObj(pNtk_00,pAVar4,0);
        for (local_440 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_440 < iVar1;
            local_440 = local_440 + 1) {
          pAVar5 = Abc_ObjFanin(pAVar4,local_440);
          Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar5->field_6).pCopy);
        }
      }
      else {
        pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
        pAVar5 = Abc_ObjChild0Copy(pAVar4);
        p1 = Abc_ObjChild1Copy(pAVar4);
        pAVar5 = Abc_AigAnd(pMan,pAVar5,p1);
        (pAVar4->field_6).pCopy = pAVar5;
      }
    }
    Abc_ObjAddFanin(pAVar3,(pNode->field_6).pCopy);
    Vec_PtrFree(vCone_00);
    Vec_PtrFree((Vec_Ptr_t *)Buffer._992_8_);
    iVar1 = Abc_NtkCheck(pNtk_00);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkCreateMffc(): Network check has failed.\n");
    }
    return pNtk_00;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                ,0x43a,"Abc_Ntk_t *Abc_NtkCreateMffc(Abc_Ntk_t *, Abc_Obj_t *, char *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateMffc( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, char * pNodeName )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeCoNew;
    Vec_Ptr_t * vCone, * vSupp;
    char Buffer[1000];
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // set the name
    sprintf( Buffer, "%s_%s", pNtk->pName, pNodeName );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // establish connection between the constant nodes
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // collect the nodes in MFFC
    vCone = Vec_PtrAlloc( 100 );
    vSupp = Vec_PtrAlloc( 100 );
    Abc_NodeDeref_rec( pNode );
    Abc_NodeMffcConeSupp( pNode, vCone, vSupp );
    Abc_NodeRef_rec( pNode );
    // create the PIs
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // create the PO
    pNodeCoNew = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAssignName( pNodeCoNew, pNodeName, NULL );
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, i )
    {
        // if it is an AIG, add to the hash table
        if ( Abc_NtkIsStrash(pNtk) )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    // connect the topmost node
    Abc_ObjAddFanin( pNodeCoNew, pNode->pCopy );
    Vec_PtrFree( vCone );
    Vec_PtrFree( vSupp );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateMffc(): Network check has failed.\n" );
    return pNtkNew;
}